

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

int __thiscall crnlib::fast_random::irand(fast_random *this,int l,int h)

{
  uint32 uVar1;
  int result;
  uint32 rnd_range;
  uint32 rnd;
  uint32 range;
  int h_local;
  int l_local;
  fast_random *this_local;
  
  this_local._4_4_ = l;
  if (l < h) {
    uVar1 = urand32(this);
    this_local._4_4_ = l + (int)((ulong)(uint)(h - l) * (ulong)uVar1 >> 0x20);
  }
  return this_local._4_4_;
}

Assistant:

int fast_random::irand(int l, int h)
    {
        CRNLIB_ASSERT(l < h);
        if (l >= h)
        {
            return l;
        }

        uint32 range = static_cast<uint32>(h - l);

        uint32 rnd = urand32();

#if defined(_M_IX86) && defined(_MSC_VER)
        //uint32 rnd_range = static_cast<uint32>(__emulu(range, rnd) >> 32U);
        uint32 x[2];
        *reinterpret_cast<uint64*>(x) = __emulu(range, rnd);
        uint32 rnd_range = x[1];
#else
        uint32 rnd_range = static_cast<uint32>((((uint64)range) * ((uint64)rnd)) >> 32U);
#endif

        int result = l + rnd_range;
        CRNLIB_ASSERT((result >= l) && (result < h));
        return result;
    }